

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilFile.c
# Opt level: O1

int Extra_ReadHexadecimal(uint *Sign,char *pString,int nVars)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  
  uVar1 = 1 << ((byte)nVars - 5 & 0x1f);
  if (nVars < 6) {
    uVar1 = 1;
  }
  if (0 < (int)uVar1) {
    memset(Sign,0,(ulong)uVar1 << 2);
  }
  iVar2 = 1 << ((byte)nVars & 0x1f);
  iVar3 = iVar2 + 3;
  if (-1 < iVar2) {
    iVar3 = iVar2;
  }
  iVar3 = iVar3 >> 2;
  if ((uint)nVars < 2) {
    iVar3 = 1;
  }
  Extra_ReadHex(Sign,pString,iVar3);
  return 1;
}

Assistant:

int Extra_ReadHexadecimal( unsigned Sign[], char * pString, int nVars )
{
    int nWords, nDigits, k;
    nWords = Extra_TruthWordNum( nVars );
    for ( k = 0; k < nWords; k++ )
        Sign[k] = 0;
    // read the number from the string
    nDigits = (1 << nVars) / 4;
    if ( nDigits == 0 )
        nDigits = 1;
    Extra_ReadHex( Sign, pString, nDigits );
    return 1;
}